

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O1

void Gia_ManFindDerive(Gia_Man_t *pNew,int nOuts,Vec_Int_t *vIns,Vec_Wec_t *vCofs,Vec_Int_t *vMap)

{
  uint uVar1;
  Gia_Obj_t *pGVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  Vec_Int_t *vMemory;
  int *piVar6;
  Vec_Int_t *p;
  void *__s;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  ulong *pTruth;
  uint uVar7;
  uint uVar8;
  Gia_Obj_t *pGVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  bool bVar22;
  
  vMemory = (Vec_Int_t *)malloc(0x10);
  vMemory->nCap = 0x10000;
  vMemory->nSize = 0;
  piVar6 = (int *)malloc(0x40000);
  vMemory->pArray = piVar6;
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 100;
  p->nSize = 0;
  piVar6 = (int *)malloc(400);
  p->pArray = piVar6;
  uVar1 = vCofs->nSize;
  uVar10 = 0x10;
  if (0xe < uVar1 - 1) {
    uVar10 = uVar1;
  }
  if (uVar10 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)(int)uVar10 * 4);
  }
  if (__s != (void *)0x0) {
    memset(__s,0,(long)(int)uVar1 * 4);
  }
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 0x10;
  p_00->nSize = 0;
  piVar6 = (int *)malloc(0x40);
  p_00->pArray = piVar6;
  p_01 = (Vec_Int_t *)malloc(0x10);
  p_01->nSize = 0;
  p_01->nCap = uVar10;
  if (uVar10 == 0) {
    piVar6 = (int *)0x0;
  }
  else {
    piVar6 = (int *)malloc((long)(int)uVar10 << 2);
  }
  p_01->pArray = piVar6;
  iVar4 = vIns->nSize;
  uVar10 = 1 << ((byte)iVar4 - 6 & 0x1f);
  if (iVar4 < 7) {
    uVar10 = 1;
  }
  pTruth = (ulong *)malloc((long)(int)uVar10 << 3);
  uVar13 = vMap->nSize;
  uVar16 = 0;
  if ((ulong)uVar13 != 0) {
    uVar16 = *vMap->pArray;
    if (1 < (int)uVar13) {
      uVar12 = 1;
      do {
        uVar7 = vMap->pArray[uVar12];
        if ((int)uVar16 <= (int)uVar7) {
          uVar16 = uVar7;
        }
        uVar12 = uVar12 + 1;
      } while (uVar13 != uVar12);
    }
  }
  uVar7 = uVar16 + 1;
  if (1 < uVar7) {
    if (uVar16 == 0) {
      uVar7 = 0;
    }
    else {
      uVar7 = 0x1f;
      if (uVar16 != 0) {
        for (; uVar16 >> uVar7 == 0; uVar7 = uVar7 - 1) {
        }
      }
      uVar7 = (uVar7 ^ 0xffffffe0) + 0x21;
    }
  }
  if (iVar4 <= (int)uVar7) {
    __assert_fail("nBits < Vec_IntSize(vIns)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMuxes.c"
                  ,0x44c,
                  "void Gia_ManFindDerive(Gia_Man_t *, int, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *)")
    ;
  }
  if (uVar13 != uVar1) {
    __assert_fail("Vec_IntSize(vMap) == Vec_WecSize(vCofs)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMuxes.c"
                  ,0x44d,
                  "void Gia_ManFindDerive(Gia_Man_t *, int, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *)")
    ;
  }
  if (uVar13 != 1 << ((byte)iVar4 & 0x1f)) {
    __assert_fail("Vec_IntSize(vMap) == (1 << Vec_IntSize(vIns))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMuxes.c"
                  ,0x44e,
                  "void Gia_ManFindDerive(Gia_Man_t *, int, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *)")
    ;
  }
  if (0 < vIns->nSize) {
    lVar14 = 0;
    do {
      iVar4 = vIns->pArray[lVar14];
      if (((long)iVar4 < 0) || (pNew->vCis->nSize <= iVar4)) {
LAB_00222efb:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar4 = pNew->vCis->pArray[iVar4];
      if (((long)iVar4 < 0) || (pNew->nObjs <= iVar4)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar2 = pNew->pObjs;
      pGVar9 = (Gia_Obj_t *)((ulong)(pGVar2 + iVar4) & 0xfffffffffffffffe);
      if ((pGVar9 < pGVar2) || (pGVar2 + pNew->nObjs <= pGVar9)) {
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      iVar5 = (int)((ulong)((long)pGVar9 - (long)pGVar2) >> 2);
      if (iVar5 * -0x55555555 < 0) {
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12e,"int Abc_Var2Lit(int, int)");
      }
      Vec_IntPush(p,((uint)(pGVar2 + iVar4) & 1) + iVar5 * 0x55555556);
      lVar14 = lVar14 + 1;
    } while (lVar14 < vIns->nSize);
  }
  if (uVar7 != 0) {
    uVar13 = 0;
    do {
      if (0 < (int)uVar10) {
        memset(pTruth,0,(ulong)uVar10 << 3);
      }
      iVar4 = vMap->nSize;
      if (0 < (long)iVar4) {
        piVar6 = vMap->pArray;
        uVar12 = 0;
        do {
          if ((piVar6[uVar12] & 1 << ((byte)uVar13 & 0x1f)) != 0) {
            pTruth[uVar12 >> 6 & 0x3ffffff] =
                 pTruth[uVar12 >> 6 & 0x3ffffff] | 1L << ((byte)uVar12 & 0x3f);
          }
          uVar12 = uVar12 + 1;
        } while ((long)iVar4 != uVar12);
      }
      if (uVar7 < 6) {
        uVar17 = vIns->nSize;
        if ((int)uVar17 < 0) {
          __assert_fail("nVars >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                        ,0x489,"word Abc_Tt6Stretch(word, int)");
        }
        uVar15 = uVar17;
        if (uVar17 < 2) {
          uVar15 = 2;
        }
        uVar11 = uVar15;
        if (uVar15 == 2) {
          uVar11 = 3;
        }
        uVar8 = uVar11;
        if (uVar11 == 3) {
          uVar8 = 4;
        }
        uVar3 = uVar8;
        if (uVar8 == 4) {
          uVar3 = 5;
        }
        if (1 < uVar3 - 5) {
          __assert_fail("nVars == 6",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                        ,0x496,"word Abc_Tt6Stretch(word, int)");
        }
        uVar18 = (uint)*pTruth;
        uVar19 = (uVar18 & 1) * 3;
        if (uVar17 != 0) {
          uVar19 = uVar18;
        }
        uVar12 = (ulong)(uVar19 & 3) * 5;
        if (1 < uVar17) {
          uVar12 = *pTruth;
        }
        uVar17 = (uint)uVar12 & 0xf;
        uVar21 = (ulong)(uVar17 << 4 | uVar17);
        if (uVar15 != 2) {
          uVar21 = uVar12;
        }
        uVar12 = (ulong)(uint)((int)(uVar21 & 0xff) << 8) | uVar21 & 0xff;
        if (uVar11 != 3) {
          uVar12 = uVar21;
        }
        uVar21 = (ulong)(uint)((int)uVar12 << 0x10) | uVar12 & 0xffff;
        if (uVar8 != 4) {
          uVar21 = uVar12;
        }
        uVar12 = uVar21 << 0x20 | uVar21 & 0xffffffff;
        if (uVar3 != 5) {
          uVar12 = uVar21;
        }
        *pTruth = uVar12;
      }
      iVar4 = Kit_TruthToGia(pNew,(uint *)pTruth,vIns->nSize,vMemory,p,1);
      Vec_IntPush(p_00,iVar4);
      uVar13 = uVar13 + 1;
    } while (uVar13 != uVar7);
  }
  if (-1 < (int)uVar16) {
    uVar10 = vMap->nSize;
    uVar13 = 0;
    do {
      uVar17 = 0xffffffff;
      if (0 < (int)uVar10) {
        uVar12 = 0;
        do {
          if (vMap->pArray[uVar12] == uVar13) {
            uVar17 = (uint)uVar12;
            break;
          }
          uVar12 = uVar12 + 1;
          uVar17 = 0xffffffff;
        } while (uVar10 != uVar12);
      }
      if (((int)uVar17 < 0) || (vCofs->nSize <= (int)uVar17)) {
        __assert_fail("Cof >= 0 && Cof < Vec_WecSize(vCofs)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMuxes.c"
                      ,0x45f,
                      "void Gia_ManFindDerive(Gia_Man_t *, int, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *)"
                     );
      }
      if ((int)uVar1 <= (int)uVar17) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      *(undefined4 *)((long)__s + (ulong)uVar17 * 4) = 1;
      bVar22 = uVar13 != uVar16;
      uVar13 = uVar13 + 1;
    } while (bVar22);
  }
  if (0 < nOuts) {
    iVar4 = 1 << ((byte)uVar7 & 0x1f);
    uVar21 = 0;
    uVar12 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar12 = uVar21;
    }
    do {
      p_01->nSize = 0;
      if (0 < vCofs->nSize) {
        lVar14 = 8;
        uVar20 = 0;
        do {
          if (uVar12 == uVar20) goto LAB_00222efb;
          if (*(int *)((long)__s + uVar20 * 4) != 0) {
            if ((long)*(int *)((long)vCofs->pArray + lVar14 + -4) <= (long)uVar21)
            goto LAB_00222efb;
            Vec_IntPush(p_01,*(int *)(*(long *)((long)&vCofs->pArray->nCap + lVar14) + uVar21 * 4));
          }
          uVar20 = uVar20 + 1;
          lVar14 = lVar14 + 0x10;
        } while ((long)uVar20 < (long)vCofs->nSize);
      }
      while (p_01->nSize < iVar4) {
        Vec_IntPush(p_01,0);
      }
      if (p_01->nSize != iVar4) {
        __assert_fail("Vec_IntSize(vData) == (1 << nBits)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMuxes.c"
                      ,0x46b,
                      "void Gia_ManFindDerive(Gia_Man_t *, int, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *)"
                     );
      }
      if (p_00->nSize != uVar7) {
        __assert_fail("Vec_IntSize(vBits) == nBits",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMuxes.c"
                      ,0x46c,
                      "void Gia_ManFindDerive(Gia_Man_t *, int, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *)"
                     );
      }
      iVar5 = Gia_ManFindMuxTree_rec(pNew,p_00->pArray,p_00->nSize,p_01,0);
      Gia_ManAppendCo(pNew,iVar5);
      uVar21 = uVar21 + 1;
    } while (uVar21 != (uint)nOuts);
  }
  if (pTruth != (ulong *)0x0) {
    free(pTruth);
  }
  if (__s != (void *)0x0) {
    free(__s);
  }
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
    p_00->pArray = (int *)0x0;
  }
  free(p_00);
  if (p_01->pArray != (int *)0x0) {
    free(p_01->pArray);
    p_01->pArray = (int *)0x0;
  }
  free(p_01);
  if (p->pArray != (int *)0x0) {
    free(p->pArray);
    p->pArray = (int *)0x0;
  }
  free(p);
  if (vMemory->pArray != (int *)0x0) {
    free(vMemory->pArray);
    vMemory->pArray = (int *)0x0;
  }
  free(vMemory);
  return;
}

Assistant:

void Gia_ManFindDerive( Gia_Man_t * pNew, int nOuts, Vec_Int_t * vIns, Vec_Wec_t * vCofs, Vec_Int_t * vMap )
{
    extern int Kit_TruthToGia( Gia_Man_t * pMan, unsigned * pTruth, int nVars, Vec_Int_t * vMemory, Vec_Int_t * vLeaves, int fHash );
    Vec_Int_t * vMemory = Vec_IntAlloc( 1 << 16 );
    Vec_Int_t * vLeaves = Vec_IntAlloc( 100 );
    Vec_Int_t * vUsed = Vec_IntStart( Vec_WecSize(vCofs) );
    Vec_Int_t * vBits = Vec_IntAlloc( 10 );
    Vec_Int_t * vData = Vec_IntAlloc( Vec_WecSize(vCofs) );
    int nWords = Abc_TtWordNum(Vec_IntSize(vIns));
    word * pTruth = ABC_ALLOC( word, nWords );
    int nValues = Vec_IntFindMax(vMap)+1;
    int i, k, Value, nBits = Abc_Base2Log(nValues);
    assert( nBits < Vec_IntSize(vIns) );
    assert( Vec_IntSize(vMap) == Vec_WecSize(vCofs) );
    assert( Vec_IntSize(vMap) == (1 << Vec_IntSize(vIns)) );
    Vec_IntForEachEntry( vIns, Value, i )
        Vec_IntPush( vLeaves, Gia_ObjToLit(pNew, Gia_ManCi(pNew, Value)) );
    for ( i = 0; i < nBits; i++ )
    {
        Abc_TtClear( pTruth, nWords );
        Vec_IntForEachEntry( vMap, Value, k )
            if ( (Value >> i) & 1 )
                Abc_TtSetBit( pTruth, k );
        if ( nBits < 6 )
            pTruth[0] = Abc_Tt6Stretch( pTruth[0], Vec_IntSize(vIns) );
        Vec_IntPush( vBits, Kit_TruthToGia(pNew, (unsigned*)pTruth, Vec_IntSize(vIns), vMemory, vLeaves, 1) );
        //printf( "Bit %d : ", i ); Dau_DsdPrintFromTruth( pTruth, Vec_IntSize(vIns) );
    }
    for ( i = 0; i < nValues; i++ )
    {
        int Cof = Vec_IntFind(vMap, i);
        assert( Cof >= 0 && Cof < Vec_WecSize(vCofs) );
        Vec_IntWriteEntry( vUsed, Cof, 1 );
    }
    for ( i = 0; i < nOuts; i++ )
    {
        Vec_Int_t * vLevel;
        Vec_IntClear( vData );
        Vec_WecForEachLevel( vCofs, vLevel, k )
            if ( Vec_IntEntry(vUsed, k) )
                Vec_IntPush( vData, Vec_IntEntry(vLevel, i) );
        while ( Vec_IntSize(vData) < (1 << nBits) )
            Vec_IntPush( vData, 0 );
        assert( Vec_IntSize(vData) == (1 << nBits) );
        assert( Vec_IntSize(vBits) == nBits );
        Value = Gia_ManFindMuxTree_rec( pNew, Vec_IntArray(vBits), Vec_IntSize(vBits), vData, 0 );
        Gia_ManAppendCo( pNew, Value );
    }
    ABC_FREE( pTruth );
    Vec_IntFree( vUsed );
    Vec_IntFree( vBits );
    Vec_IntFree( vData );
    Vec_IntFree( vLeaves );
    Vec_IntFree( vMemory );
}